

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_andnot(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  short sVar5;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int32_t end2;
  int32_t start2;
  int32_t end;
  int32_t start;
  int rlepos2;
  int rlepos1;
  uint local_30;
  uint local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  int32_t in_stack_ffffffffffffffdc;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar7;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar8;
  
  if (in_RDX[1] < *in_RDI + *in_RSI) {
    run_container_grow((run_container_t *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc,SUB41((uint)in_stack_ffffffffffffffd8 >> 0x18,0));
  }
  *in_RDX = 0;
  iVar8 = 0;
  iVar7 = 0;
  uVar3 = (uint)**(ushort **)(in_RDI + 2) + (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2) + 1;
  local_2c = (uint)**(ushort **)(in_RSI + 2);
  local_30 = local_2c + *(ushort *)(*(long *)(in_RSI + 2) + 2) + 1;
  uVar4 = (uint)**(ushort **)(in_RDI + 2);
  while( true ) {
    uVar6 = uVar4;
    bVar2 = false;
    if (iVar8 < *in_RDI) {
      bVar2 = iVar7 < *in_RSI;
    }
    sVar5 = (short)uVar6;
    if (!bVar2) break;
    uVar4 = uVar6;
    if (local_2c < uVar3) {
      if (uVar6 < local_30) {
        if (uVar6 < local_2c) {
          iVar1 = *in_RDX;
          *in_RDX = iVar1 + 1;
          *(uint *)(*(long *)(in_RDX + 2) + (long)iVar1 * 4) =
               CONCAT22(((short)local_2c - sVar5) + -1,sVar5);
        }
        uVar4 = local_30;
        if ((uVar3 <= local_30) && (iVar8 = iVar8 + 1, uVar4 = uVar6, iVar8 < *in_RDI)) {
          uVar4 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)iVar8 * 4);
          uVar3 = uVar4 + *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)iVar8 * 4) + 1;
        }
      }
      else {
        iVar7 = iVar7 + 1;
        if (iVar7 < *in_RSI) {
          local_2c = (uint)*(ushort *)(*(long *)(in_RSI + 2) + (long)iVar7 * 4);
          local_30 = local_2c + *(ushort *)(*(long *)(in_RSI + 2) + 2 + (long)iVar7 * 4) + 1;
        }
      }
    }
    else {
      iVar1 = *in_RDX;
      *in_RDX = iVar1 + 1;
      *(uint *)(*(long *)(in_RDX + 2) + (long)iVar1 * 4) =
           CONCAT22(((short)uVar3 - sVar5) + -1,sVar5);
      iVar8 = iVar8 + 1;
      if (iVar8 < *in_RDI) {
        uVar4 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)iVar8 * 4);
        uVar3 = uVar4 + *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)iVar8 * 4) + 1;
      }
    }
  }
  if (iVar8 < *in_RDI) {
    iVar7 = *in_RDX;
    *in_RDX = iVar7 + 1;
    *(uint *)(*(long *)(in_RDX + 2) + (long)iVar7 * 4) = CONCAT22(((short)uVar3 - sVar5) + -1,sVar5)
    ;
    iVar8 = iVar8 + 1;
    if (iVar8 < *in_RDI) {
      memcpy((void *)(*(long *)(in_RDX + 2) + (long)*in_RDX * 4),
             (void *)(*(long *)(in_RDI + 2) + (long)iVar8 * 4),(long)(*in_RDI - iVar8) << 2);
      *in_RDX = (*in_RDI - iVar8) + *in_RDX;
    }
  }
  return;
}

Assistant:

void run_container_andnot(const run_container_t *src_1,
                          const run_container_t *src_2, run_container_t *dst) {
    // following Java implementation as of June 2016

    if (dst->capacity < src_1->n_runs + src_2->n_runs)
        run_container_grow(dst, src_1->n_runs + src_2->n_runs, false);

    dst->n_runs = 0;

    int rlepos1 = 0;
    int rlepos2 = 0;
    int32_t start = src_1->runs[rlepos1].value;
    int32_t end = start + src_1->runs[rlepos1].length + 1;
    int32_t start2 = src_2->runs[rlepos2].value;
    int32_t end2 = start2 + src_2->runs[rlepos2].length + 1;

    while ((rlepos1 < src_1->n_runs) && (rlepos2 < src_2->n_runs)) {
        if (end <= start2) {
            // output the first run
            dst->runs[dst->n_runs++] =
                CROARING_MAKE_RLE16(start, end - start - 1);
            rlepos1++;
            if (rlepos1 < src_1->n_runs) {
                start = src_1->runs[rlepos1].value;
                end = start + src_1->runs[rlepos1].length + 1;
            }
        } else if (end2 <= start) {
            // exit the second run
            rlepos2++;
            if (rlepos2 < src_2->n_runs) {
                start2 = src_2->runs[rlepos2].value;
                end2 = start2 + src_2->runs[rlepos2].length + 1;
            }
        } else {
            if (start < start2) {
                dst->runs[dst->n_runs++] =
                    CROARING_MAKE_RLE16(start, start2 - start - 1);
            }
            if (end2 < end) {
                start = end2;
            } else {
                rlepos1++;
                if (rlepos1 < src_1->n_runs) {
                    start = src_1->runs[rlepos1].value;
                    end = start + src_1->runs[rlepos1].length + 1;
                }
            }
        }
    }
    if (rlepos1 < src_1->n_runs) {
        dst->runs[dst->n_runs++] = CROARING_MAKE_RLE16(start, end - start - 1);
        rlepos1++;
        if (rlepos1 < src_1->n_runs) {
            memcpy(dst->runs + dst->n_runs, src_1->runs + rlepos1,
                   sizeof(rle16_t) * (src_1->n_runs - rlepos1));
            dst->n_runs += src_1->n_runs - rlepos1;
        }
    }
}